

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

void Edg_ManCollectCritEdges(Gia_Man_t *p,Vec_Wec_t *vEdges,int DelayMax)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  int iVar5;
  size_t __size;
  long lVar6;
  
  if ((p->vEdge1 == (Vec_Int_t *)0x0) || (p->vEdge2 == (Vec_Int_t *)0x0)) {
    __assert_fail("p->vEdge1 && p->vEdge2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                  ,0x2f4,"void Edg_ManCollectCritEdges(Gia_Man_t *, Vec_Wec_t *, int)");
  }
  iVar2 = vEdges->nSize;
  if (0 < (long)iVar2) {
    pVVar3 = vEdges->pArray;
    lVar4 = 0;
    do {
      *(undefined4 *)((long)&pVVar3->nSize + lVar4) = 0;
      lVar4 = lVar4 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar4);
  }
  vEdges->nSize = 0;
  iVar2 = (int)((long)DelayMax + 1);
  if (vEdges->nCap <= DelayMax) {
    if (vEdges->pArray == (Vec_Int_t *)0x0) {
      pVVar3 = (Vec_Int_t *)malloc((long)iVar2 << 4);
    }
    else {
      pVVar3 = (Vec_Int_t *)realloc(vEdges->pArray,(long)iVar2 << 4);
    }
    vEdges->pArray = pVVar3;
    memset(pVVar3 + vEdges->nCap,0,(((long)DelayMax + 1) - (long)vEdges->nCap) * 0x10);
    vEdges->nCap = iVar2;
  }
  vEdges->nSize = iVar2;
  if (1 < p->nObjs) {
    lVar6 = 1;
    lVar4 = 0x14;
    do {
      if (p->vMapping2->nSize <= lVar6) {
LAB_001fb2c3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (*(int *)((long)&p->vMapping2->pArray->nCap + lVar4) != 0) {
        if (p->vEdgeDelay->nSize <= lVar6) {
LAB_001fb2e2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (p->vEdgeDelayR->nSize <= lVar6) goto LAB_001fb2e2;
        uVar1 = p->vEdgeDelay->pArray[lVar6];
        iVar2 = p->vEdgeDelayR->pArray[lVar6] + uVar1;
        if (DelayMax < iVar2) {
          __assert_fail("Delay1 + Delay2 <= DelayMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                        ,0x2fb,"void Edg_ManCollectCritEdges(Gia_Man_t *, Vec_Wec_t *, int)");
        }
        if (iVar2 == DelayMax) {
          if (vEdges->nSize <= (int)uVar1) {
            iVar5 = uVar1 + 1;
            iVar2 = vEdges->nSize * 2;
            if (iVar2 <= iVar5) {
              iVar2 = iVar5;
            }
            if (vEdges->nCap < iVar2) {
              __size = (long)iVar2 << 4;
              if (vEdges->pArray == (Vec_Int_t *)0x0) {
                pVVar3 = (Vec_Int_t *)malloc(__size);
              }
              else {
                pVVar3 = (Vec_Int_t *)realloc(vEdges->pArray,__size);
              }
              vEdges->pArray = pVVar3;
              memset(pVVar3 + vEdges->nCap,0,((long)iVar2 - (long)vEdges->nCap) * 0x10);
              vEdges->nCap = iVar2;
            }
            vEdges->nSize = iVar5;
          }
          if (((int)uVar1 < 0) || (vEdges->nSize <= (int)uVar1)) goto LAB_001fb2c3;
          Vec_IntPush(vEdges->pArray + uVar1,(int)lVar6);
        }
      }
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar6 < p->nObjs);
  }
  if (1 < (long)vEdges->nSize) {
    lVar4 = 0;
    do {
      if (*(int *)((long)&vEdges->pArray[1].nSize + lVar4) < 1) {
        __assert_fail("Vec_IntSize(vLevel) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                      ,0x302,"void Edg_ManCollectCritEdges(Gia_Man_t *, Vec_Wec_t *, int)");
      }
      lVar4 = lVar4 + 0x10;
    } while ((long)vEdges->nSize * 0x10 + -0x10 != lVar4);
  }
  return;
}

Assistant:

void Edg_ManCollectCritEdges( Gia_Man_t * p, Vec_Wec_t * vEdges, int DelayMax )
{
    Vec_Int_t * vLevel;
    int k, iLut, Delay1, Delay2;
    assert( p->vEdge1 && p->vEdge2 );
    Vec_WecClear( vEdges );
    Vec_WecInit( vEdges, DelayMax + 1 );
    Gia_ManForEachLut2( p, iLut )
    {
        Delay1 = Vec_IntEntry( p->vEdgeDelay, iLut );
        Delay2 = Vec_IntEntry( p->vEdgeDelayR, iLut );
        assert( Delay1 + Delay2 <= DelayMax );
        if ( Delay1 + Delay2 == DelayMax )
            Vec_WecPush( vEdges, Delay1, iLut );
    }
    // every level should have critical nodes, except the first one
    //Vec_WecPrint( vEdges, 0 );
    Vec_WecForEachLevelStart( vEdges, vLevel, k, 1 )
        assert( Vec_IntSize(vLevel) > 0 );
}